

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_string_utils.cpp
# Opt level: O3

string * get_format_string_abi_cxx11_(string *__return_storage_ptr__,char *format,...)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  char in_AL;
  int iVar4;
  int iVar5;
  char *pcVar6;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char buf [4096];
  undefined8 local_1108;
  undefined1 *local_1100;
  undefined1 *local_10f8;
  undefined1 local_10e8 [16];
  undefined8 local_10d8;
  undefined8 local_10d0;
  undefined8 local_10c8;
  undefined8 local_10c0;
  undefined8 local_10b8;
  undefined8 local_10a8;
  undefined8 local_1098;
  undefined8 local_1088;
  undefined8 local_1078;
  undefined8 local_1068;
  undefined8 local_1058;
  undefined8 local_1048;
  char local_1038 [4104];
  
  if (in_AL != '\0') {
    local_10b8 = in_XMM0_Qa;
    local_10a8 = in_XMM1_Qa;
    local_1098 = in_XMM2_Qa;
    local_1088 = in_XMM3_Qa;
    local_1078 = in_XMM4_Qa;
    local_1068 = in_XMM5_Qa;
    local_1058 = in_XMM6_Qa;
    local_1048 = in_XMM7_Qa;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_10d8 = in_RDX;
  local_10d0 = in_RCX;
  local_10c8 = in_R8;
  local_10c0 = in_R9;
  memset(local_1038,0,0x1000);
  local_1100 = &stack0x00000008;
  local_1108 = 0x3000000010;
  local_10f8 = local_10e8;
  iVar4 = vsnprintf(local_1038,0x1000,format,&local_1108);
  if (0xfff < iVar4) {
    pcVar6 = (char *)0x0;
    iVar4 = 0x1000;
    do {
      if (pcVar6 != (char *)0x0) {
        free(pcVar6);
      }
      iVar3 = iVar4 * 2;
      pcVar6 = (char *)calloc(1,(long)iVar3);
      local_1108 = 0x3000000010;
      local_1100 = &stack0x00000008;
      local_10f8 = local_10e8;
      iVar5 = vsnprintf(pcVar6,(long)iVar3,format,&local_1108);
      iVar2 = iVar4 * -2;
      iVar4 = iVar3;
    } while (SBORROW4(iVar5,iVar3) == iVar5 + iVar2 < 0);
    if (pcVar6 != (char *)0x0) {
      pcVar1 = (char *)__return_storage_ptr__->_M_string_length;
      strlen(pcVar6);
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar1,(ulong)pcVar6);
      free(pcVar6);
      return __return_storage_ptr__;
    }
  }
  pcVar6 = (char *)__return_storage_ptr__->_M_string_length;
  strlen(local_1038);
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar6,(ulong)local_1038);
  return __return_storage_ptr__;
}

Assistant:

std::string get_format_string(const char * format, ...) {
  std::string res;
  char buf[4096] = {};
  char* backup_buf = NULL;
  int cur_buf_len = sizeof(buf);
  va_list ap;
  va_start(ap, format);
  int len = vsnprintf(buf, cur_buf_len, format, ap);
  va_end(ap);
  while(len >= cur_buf_len) {
    cur_buf_len *= 2;
    if(backup_buf) {
      free(backup_buf);
    }

    backup_buf = (char*)calloc(1, cur_buf_len);
    va_start(ap, format);
    len = vsnprintf(backup_buf, cur_buf_len, format, ap);
    va_end(ap);
  }
  

  if(backup_buf) {
    res =backup_buf;
    free(backup_buf);
  } else {
    res = buf;
  }
  return res;
}